

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O1

void __thiscall
SmallVector_CtorInitializerList2_Test::TestBody(SmallVector_CtorInitializerList2_Test *this)

{
  char *message;
  initializer_list<int> init;
  AssertionResult gtest_ar;
  small_vector<int,_2UL> b;
  char local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_58;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  undefined1 *puStack_40;
  small_vector<int,_2UL> local_38;
  
  local_60[0] = '\x01';
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = '\x02';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  pbStack_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
  init._M_len = 4;
  init._M_array = (iterator)local_60;
  pstore::small_vector<int,_2UL>::small_vector(&local_38,init);
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000004;
  puStack_40 = &DAT_100000002;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_60,(char *)&local_48,(small_vector<int,_2UL> *)0x209135);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (pbStack_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (pbStack_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x3d,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (pbStack_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_58,pbStack_58);
  }
  if (local_38.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST (SmallVector, CtorInitializerList2) {
    pstore::small_vector<int, 2> b{1, 2, 3, 4};
    EXPECT_THAT (b, ::testing::ElementsAre (1, 2, 3, 4));
}